

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O2

void opengv::absolute_pose::modules::gp3p::sPolynomial37
               (Matrix<double,_48,_85,_0,_48,_85> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xc1e];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x5c5] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xc4e] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).
          m_storage.m_data.array[0xd2c];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x625] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xd5c] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xcde] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x655] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xd0e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x835] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe1c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x8f5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe4c] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xdce] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x925] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xdfe] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x955] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe2e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x985] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe5e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0x9e5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xe7c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xa75] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xe8e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xc25] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf3c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xce5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf6c] / dVar2 -
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xeee] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xd15] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf1e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xd45] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf4e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xd75] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xf7e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xdd5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xf9c] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xe65] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfae] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xef5] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
       m_data.array[0xfcc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage.
  m_data.array[0xf85] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_48,_85,_0,_48,_85>_>).m_storage
        .m_data.array[0xfde] / dVar1;
  return;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::sPolynomial37( Eigen::Matrix<double,48,85> & groebnerMatrix )
{
  groebnerMatrix(37,30) = -groebnerMatrix(30,65)/(groebnerMatrix(30,64));
  groebnerMatrix(37,32) = (groebnerMatrix(12,71)/(groebnerMatrix(12,70))-groebnerMatrix(30,68)/(groebnerMatrix(30,64)));
  groebnerMatrix(37,33) = -groebnerMatrix(30,69)/(groebnerMatrix(30,64));
  groebnerMatrix(37,43) = groebnerMatrix(12,75)/(groebnerMatrix(12,70));
  groebnerMatrix(37,47) = (groebnerMatrix(12,76)/(groebnerMatrix(12,70))-groebnerMatrix(30,73)/(groebnerMatrix(30,64)));
  groebnerMatrix(37,48) = -groebnerMatrix(30,74)/(groebnerMatrix(30,64));
  groebnerMatrix(37,49) = -groebnerMatrix(30,75)/(groebnerMatrix(30,64));
  groebnerMatrix(37,50) = -groebnerMatrix(30,76)/(groebnerMatrix(30,64));
  groebnerMatrix(37,52) = groebnerMatrix(12,77)/(groebnerMatrix(12,70));
  groebnerMatrix(37,55) = -groebnerMatrix(30,77)/(groebnerMatrix(30,64));
  groebnerMatrix(37,64) = groebnerMatrix(12,81)/(groebnerMatrix(12,70));
  groebnerMatrix(37,68) = (groebnerMatrix(12,82)/(groebnerMatrix(12,70))-groebnerMatrix(30,79)/(groebnerMatrix(30,64)));
  groebnerMatrix(37,69) = -groebnerMatrix(30,80)/(groebnerMatrix(30,64));
  groebnerMatrix(37,70) = -groebnerMatrix(30,81)/(groebnerMatrix(30,64));
  groebnerMatrix(37,71) = -groebnerMatrix(30,82)/(groebnerMatrix(30,64));
  groebnerMatrix(37,73) = groebnerMatrix(12,83)/(groebnerMatrix(12,70));
  groebnerMatrix(37,76) = -groebnerMatrix(30,83)/(groebnerMatrix(30,64));
  groebnerMatrix(37,79) = groebnerMatrix(12,84)/(groebnerMatrix(12,70));
  groebnerMatrix(37,82) = -groebnerMatrix(30,84)/(groebnerMatrix(30,64));
}